

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

StackSym * __thiscall GlobOpt::GetTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  IntConstantToStackSymMap *pIVar1;
  Type piVar2;
  uint uVar3;
  Type pSVar4;
  uint uVar5;
  
  pIVar1 = this->intConstantToStackSymMap;
  piVar2 = pIVar1->buckets;
  uVar3 = 0;
  if (piVar2 != (Type)0x0) {
    uVar3 = JsUtil::
            BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(intConstantValue * 2 + 1,pIVar1->bucketCount,pIVar1->modFunctionIndex);
    uVar5 = piVar2[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      pSVar4 = pIVar1->entries;
      uVar3 = 0;
      do {
        if (pSVar4[uVar5].
            super_DefaultHashedEntry<long,_StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<long,_StackSym_*>.
            super_ValueEntry<StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_StackSym_*>_>
            .super_KeyValueEntryDataLayout2<long,_StackSym_*>.key == (long)intConstantValue) {
          if (pIVar1->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pIVar1->stats,uVar3);
            pSVar4 = pIVar1->entries;
          }
          return pSVar4[uVar5].
                 super_DefaultHashedEntry<long,_StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<long,_StackSym_*>.
                 super_ValueEntry<StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_StackSym_*>_>
                 .super_KeyValueEntryDataLayout2<long,_StackSym_*>.value;
        }
        uVar3 = uVar3 + 1;
        uVar5 = pSVar4[uVar5].
                super_DefaultHashedEntry<long,_StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<long,_StackSym_*>.
                super_ValueEntry<StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_StackSym_*>_>
                .super_KeyValueEntryDataLayout2<long,_StackSym_*>.next;
      } while (-1 < (int)uVar5);
    }
  }
  if (pIVar1->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pIVar1->stats,uVar3);
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym *GlobOpt::GetTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    Assert(!Js::TaggedInt::IsOverflow(intConstantValue));

    return intConstantToStackSymMap->Lookup(intConstantValue, nullptr);
}